

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

void __thiscall VulkanHppGenerator::distributeSecondLevelCommands(VulkanHppGenerator *this)

{
  _Rb_tree_node_base *__rhs;
  _Base_ptr __x;
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  uint __line;
  bool bVar3;
  __type_conflict _Var4;
  iterator iVar5;
  iterator iVar6;
  iterator __position;
  _Rb_tree_node_base *p_Var7;
  char *__assertion;
  _Base_ptr p_Var8;
  
  p_Var7 = (this->m_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_handles)._M_t._M_impl.super__Rb_tree_header;
  while( true ) {
    if ((_Rb_tree_header *)p_Var7 == p_Var1) {
      return;
    }
    if (p_Var7[1]._M_parent != (_Base_ptr)0x0) break;
LAB_0010ab11:
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  }
  __rhs = p_Var7 + 1;
  __position._M_node = p_Var7[5]._M_right;
LAB_0010a9b3:
  do {
    if (__position._M_node == (_Base_ptr)&p_Var7[5]._M_parent) goto LAB_0010ab11;
    __x = __position._M_node + 1;
    bVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::contains(&this->m_RAIISpecialFunctions,(key_type *)__x);
    if (!bVar3) {
      iVar5 = anon_unknown.dwarf_dd40c::findByNameOrAlias<VulkanHppGenerator::CommandData>
                        (&this->m_commands,__x);
      if ((_Rb_tree_header *)iVar5._M_node == &(this->m_commands)._M_t._M_impl.super__Rb_tree_header
         ) {
        __assertion = "commandIt != m_commands.end()";
        __line = 0x6b;
LAB_0010ab7b:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,__line,"void VulkanHppGenerator::distributeSecondLevelCommands()");
      }
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (iVar5._M_node[5]._M_parent + 1),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __rhs);
      if (!_Var4) {
        __assertion = "commandIt->second.params.front().type.type == handle.first";
        __line = 0x6c;
        goto LAB_0010ab7b;
      }
      if (1 < (ulong)(((long)iVar5._M_node[5]._M_left - (long)iVar5._M_node[5]._M_parent) / 0x108))
      {
        bVar3 = isHandleType(this,(string *)&iVar5._M_node[5]._M_parent[9]._M_parent);
        if ((bVar3) && (*(char *)&iVar5._M_node[5]._M_parent[0xe]._M_right == '\0')) {
          iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
                  ::find(&(this->m_handles)._M_t,
                         (key_type *)&iVar5._M_node[5]._M_parent[9]._M_parent);
          if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
            __assertion = "handleIt != m_handles.end()";
            __line = 0x70;
            goto LAB_0010ab7b;
          }
          if (iVar6._M_node[0xd]._M_left == iVar6._M_node[0xd]._M_right) {
            __assertion = "!handleIt->second.constructorIts.empty()";
            __line = 0x73;
            goto LAB_0010ab7b;
          }
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(*(long *)iVar6._M_node[0xd]._M_left + 0x88),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__rhs);
          if (_Var4) {
            p_Var8 = iVar6._M_node[0xd]._M_left;
            p_Var2 = iVar6._M_node[0xd]._M_right;
            while (p_Var8 != p_Var2) {
              _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(*(long *)p_Var8 + 0x88),
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__rhs);
              p_Var8 = (_Base_ptr)&p_Var8->_M_parent;
              if (!_Var4) {
                __assertion = 
                "std::ranges::none_of( handleIt->second.constructorIts, [&handle]( auto const & constructorIt ) { return constructorIt->second.handle != handle.first; } )"
                ;
                __line = 0x77;
                goto LAB_0010ab7b;
              }
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&iVar6._M_node[0xb]._M_left,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x);
            __position = std::
                         _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                             *)(p_Var7 + 5),__position._M_node);
            goto LAB_0010a9b3;
          }
        }
      }
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

void VulkanHppGenerator::distributeSecondLevelCommands()
{
  // distribute commands from instance/device to second-level handles, like Queue, Event,... for RAII handles
  for ( auto & handle : m_handles )
  {
    if ( !handle.first.empty() )
    {
      for ( auto command = handle.second.commands.begin(); command != handle.second.commands.end(); )
      {
        bool foundCommand = false;
        if ( !m_RAIISpecialFunctions.contains( *command ) )
        {
          auto commandIt = findByNameOrAlias( m_commands, *command );
          assert( commandIt != m_commands.end() );
          assert( commandIt->second.params.front().type.type == handle.first );
          if ( ( 1 < commandIt->second.params.size() ) && ( isHandleType( commandIt->second.params[1].type.type ) ) && !commandIt->second.params[1].optional )
          {
            auto handleIt = m_handles.find( commandIt->second.params[1].type.type );
            assert( handleIt != m_handles.end() );
            // filter out functions seem to fit due to taking handles as first and second argument, but the first argument is not the
            // type to create the second one, and so it's unknown to the raii handle!
            assert( !handleIt->second.constructorIts.empty() );
            if ( ( *handleIt->second.constructorIts.begin() )->second.handle == handle.first )
            {
              assert( std::ranges::none_of( handleIt->second.constructorIts,
                                            [&handle]( auto const & constructorIt ) { return constructorIt->second.handle != handle.first; } ) );
              handleIt->second.secondLevelCommands.insert( *command );
              command      = handle.second.commands.erase( command );
              foundCommand = true;
            }
          }
        }
        if ( !foundCommand )
        {
          ++command;
        }
      }
    }
  }
}